

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::capacitor_allocation(Graph *this)

{
  double dVar1;
  double *pdVar2;
  Vertex *unaff_R12;
  double dVar3;
  Capacitor local_78;
  Capacitor local_50;
  
  Capacitor::Capacitor
            (&local_50,
             (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl
             .super__Vector_impl_data._M_start);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.powerSteps.super__Vector_base<double,_std::allocator<double>_>);
  evaluateLossesAndFlows(this,1e-12,1);
  getTotalLoss(this);
  pdVar2 = getTotalLoss(this);
  for (dVar3 = local_50.cost + local_50.cost; local_50.cost < dVar3; dVar3 = dVar3 - dVar1) {
    dVar3 = pdVar2[1];
    unaff_R12 = greedyCapacitorAllocation(this);
    Capacitor::Capacitor
              (&local_78,
               (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>.
               _M_impl.super__Vector_impl_data._M_start);
    Vertex::addCapacitor(unaff_R12,&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_78.powerSteps.super__Vector_base<double,_std::allocator<double>_>);
    evaluateLossesAndFlows(this,1e-12,1);
    pdVar2 = getTotalLoss(this);
    dVar1 = pdVar2[1];
    getTotalLoss(this);
    pdVar2 = getTotalLoss(this);
  }
  Vertex::rmLastCapacitor(unaff_R12);
  return;
}

Assistant:

void Graph::capacitor_allocation(){
    int idLoad = 1;
    double capacitor_cost = this->getCapacitorType(1).getCost();   // Custo do capacitor em kW
    this->evaluateLossesAndFlows(1e-12, idLoad);                   // Avalia no nível de carga mais pesado?

    double * last_loss_cost = new double[2];
    last_loss_cost[0] = this->getTotalLoss()[0];
    last_loss_cost[1] = this->getTotalLoss()[1];
    double cost_change = capacitor_cost*2;

//    uint iter = 0;
    Vertex * alloc_vertex ;
    while( capacitor_cost < cost_change ) {
        alloc_vertex = this->greedyCapacitorAllocation();
//        cout << "Vertice cap: " << alloc_vertex->getID() << endl;
        alloc_vertex->addCapacitor( this->getCapacitorType(1) );
        this->evaluateLossesAndFlows(1e-12, idLoad);
        cost_change = last_loss_cost[1] - this->getTotalLoss()[1];
//        cout << "  Total Loss:  " << graph->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Total Cost:  " << graph->getTotalLoss()[1] << "US$"  << endl;
//        cout << "  Loss Change: " << last_loss_cost[0] - this->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Cost Change: " << cost_change  << " US$"     << endl;
        last_loss_cost[0] = this->getTotalLoss()[0];
        last_loss_cost[1] = this->getTotalLoss()[1];
//        iter++;
    }

    alloc_vertex->rmLastCapacitor();
//    iter--;
//    cout << "Num caps: " << iter << endl;
}